

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

string * __thiscall
wabt::(anonymous_namespace)::CWriter::DefineInstanceMemberName_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,ModuleFieldType type,string_view name)

{
  SymbolSet *set;
  long *plVar1;
  string *extraout_RAX;
  long *plVar2;
  undefined4 in_register_00000014;
  long *plVar3;
  string *psVar4;
  char *pcVar5;
  string *unique;
  string_view sVar6;
  string_view proposed_name;
  string_view name_00;
  string_view wasm_name;
  string *c_name;
  long local_60;
  long lStack_58;
  string local_50;
  
  sVar6._M_str._4_4_ = in_register_00000014;
  sVar6._M_str._0_4_ = type;
  psVar4 = (string *)name._M_str;
  if ((int)type < 0x7f) {
    sVar6._M_len = (size_t)psVar4;
    c_name = psVar4;
    sVar6 = anon_unknown_0::StripLeadingDollar((anon_unknown_0 *)name._M_len,sVar6);
    name_00._M_len = sVar6._M_str;
    name_00._M_str = (char *)0x0;
    Mangle_abi_cxx11_(&local_50,(CWriter *)sVar6._M_len,name_00,SUB81(psVar4,0));
    pcVar5 = (char *)0x4;
    plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1ec2d4);
    plVar3 = plVar1 + 2;
    if ((long *)*plVar1 == plVar3) {
      local_60 = *plVar3;
      lStack_58 = plVar1[3];
      plVar2 = &local_60;
    }
    else {
      local_60 = *plVar3;
      plVar2 = (long *)*plVar1;
    }
    set = (SymbolSet *)plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    proposed_name._M_str = pcVar5;
    proposed_name._M_len = (size_t)plVar2;
    anon_unknown_0::CWriter::FindUniqueName
              (__return_storage_ptr__,(CWriter *)(this + 0x158),set,proposed_name);
    wasm_name._M_str = (char *)__return_storage_ptr__;
    wasm_name._M_len = (size_t)c_name;
    anon_unknown_0::CWriter::ClaimName
              ((CWriter *)(this + 0x158),(SymbolSet *)(this + 0x98),
               (SymbolMap *)(ulong)(uint)(int)(char)((char)type + 'a'),(char)name._M_len,wasm_name,
               c_name);
    if (plVar2 != &local_60) {
      operator_delete(plVar2,local_60 + 1);
    }
    psVar4 = (string *)&local_50.field_2;
    if ((string *)local_50._M_dataplus._M_p != psVar4) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      psVar4 = extraout_RAX;
    }
    return psVar4;
  }
  __assert_fail("static_cast<std::underlying_type<ModuleFieldType>::type>(type) < std::numeric_limits<char>::max()"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                ,0x2a3,
                "static char wabt::(anonymous namespace)::CWriter::MangleField(ModuleFieldType)");
}

Assistant:

constexpr char CWriter::MangleField(ModuleFieldType type) {
  assert(static_cast<std::underlying_type<ModuleFieldType>::type>(type) <
         std::numeric_limits<char>::max());
  return 'a' + static_cast<char>(type);
}